

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcReinforcingElement::IfcReinforcingElement
          (IfcReinforcingElement *this,void **vtt)

{
  void *pvVar1;
  
  IfcBuildingElementComponent::IfcBuildingElementComponent
            (&this->super_IfcBuildingElementComponent,vtt + 1);
  pvVar1 = vtt[0x32];
  *(void **)&(this->super_IfcBuildingElementComponent).super_IfcBuildingElement.field_0x158 = pvVar1
  ;
  *(void **)(&(this->super_IfcBuildingElementComponent).super_IfcBuildingElement.field_0x158 +
            *(long *)((long)pvVar1 + -0x18)) = vtt[0x33];
  *(undefined8 *)&(this->super_IfcBuildingElementComponent).field_0x160 = 0;
  pvVar1 = *vtt;
  *(void **)&(this->super_IfcBuildingElementComponent).super_IfcBuildingElement.super_IfcElement.
             super_IfcProduct.super_IfcObject = pvVar1;
  *(void **)(&(this->super_IfcBuildingElementComponent).super_IfcBuildingElement.super_IfcElement.
              super_IfcProduct.super_IfcObject.field_0x0 + *(long *)((long)pvVar1 + -0x18)) =
       vtt[0x34];
  *(void **)&(this->super_IfcBuildingElementComponent).super_IfcBuildingElement.super_IfcElement.
             super_IfcProduct.super_IfcObject.field_0x88 = vtt[0x35];
  (this->super_IfcBuildingElementComponent).super_IfcBuildingElement.super_IfcElement.
  super_IfcProduct.super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)vtt[0x36];
  *(void **)&(this->super_IfcBuildingElementComponent).super_IfcBuildingElement.super_IfcElement.
             super_IfcProduct.super_IfcObject.field_0xd0 = vtt[0x37];
  *(void **)&(this->super_IfcBuildingElementComponent).super_IfcBuildingElement.super_IfcElement.
             super_IfcProduct.field_0x100 = vtt[0x38];
  *(void **)&(this->super_IfcBuildingElementComponent).super_IfcBuildingElement.super_IfcElement.
             field_0x138 = vtt[0x39];
  *(void **)&(this->super_IfcBuildingElementComponent).super_IfcBuildingElement.super_IfcElement.
             field_0x148 = vtt[0x3a];
  *(void **)&(this->super_IfcBuildingElementComponent).super_IfcBuildingElement.field_0x158 =
       vtt[0x3b];
  *(undefined1 **)&(this->super_IfcBuildingElementComponent).field_0x168 = &this->field_0x178;
  *(undefined8 *)&this->field_0x170 = 0;
  this->field_0x178 = 0;
  this->field_0x188 = 0;
  return;
}

Assistant:

IfcReinforcingElement() : Object("IfcReinforcingElement") {}